

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O0

int SUNNonlinSolFree(SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver NLS_local;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    NLS_local._4_4_ = 0;
  }
  else if (NLS->ops == (_generic_SUNNonlinearSolver_Ops *)0x0) {
    NLS_local._4_4_ = 0;
  }
  else if (NLS->ops->free == (_func_int_SUNNonlinearSolver *)0x0) {
    if (NLS->content != (void *)0x0) {
      free(NLS->content);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (_generic_SUNNonlinearSolver_Ops *)0x0) {
      free(NLS->ops);
      NLS->ops = (_generic_SUNNonlinearSolver_Ops *)0x0;
    }
    free(NLS);
    NLS_local._4_4_ = 0;
  }
  else {
    NLS_local._4_4_ = (*NLS->ops->free)(NLS);
  }
  return NLS_local._4_4_;
}

Assistant:

int SUNNonlinSolFree(SUNNonlinearSolver NLS)
{
  if (NLS == NULL) return(SUN_NLS_SUCCESS);
  if (NLS->ops == NULL) return(SUN_NLS_SUCCESS);

  if (NLS->ops->free) {
    return(NLS->ops->free(NLS));
  } else {
    /* free the content structure */
    if (NLS->content) {
      free(NLS->content);
      NLS->content = NULL;
    }
    /* free the ops structure */
    if (NLS->ops) {
      free(NLS->ops);
      NLS->ops = NULL;
    }
    /* free the nonlinear solver */
    free(NLS);
    return(SUN_NLS_SUCCESS);
  }
}